

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult
testing::internal::
CmpHelperEQ<mp::BasicSuffixSet<std::allocator<char>>::iterator,mp::BasicSuffixSet<std::allocator<char>>::iterator>
          (char *expected_expression,char *actual_expression,iterator *expected,iterator *actual)

{
  bool bVar1;
  char *in_RCX;
  iterator *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  iterator *in_RSI;
  undefined8 in_RDI;
  string *in_R8;
  AssertionResult AVar3;
  iterator *in_stack_ffffffffffffff58;
  iterator in_stack_ffffffffffffff60;
  string local_70 [32];
  string local_50 [31];
  undefined1 in_stack_ffffffffffffffcf;
  string *actual_value;
  iterator *expected_expression_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  actual_value = *(string **)in_R8;
  bVar1 = mp::BasicSuffixSet<std::allocator<char>_>::iterator::operator==
                    (in_stack_ffffffffffffff58,in_stack_ffffffffffffff60);
  if (bVar1) {
    AVar3 = AssertionSuccess();
    sVar2 = AVar3.message_.ptr_;
  }
  else {
    expected_expression_00 = in_RDX;
    FormatForComparisonFailureMessage<mp::BasicSuffixSet<std::allocator<char>>::iterator,mp::BasicSuffixSet<std::allocator<char>>::iterator>
              (in_RDX,in_RSI);
    FormatForComparisonFailureMessage<mp::BasicSuffixSet<std::allocator<char>>::iterator,mp::BasicSuffixSet<std::allocator<char>>::iterator>
              (in_RDX,in_RSI);
    EqFailure((char *)expected_expression_00,in_RCX,in_R8,actual_value,
              (bool)in_stack_ffffffffffffffcf);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_50);
    sVar2.ptr_ = extraout_RDX;
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = in_RDI;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                                // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}